

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O2

wchar_t scp_get_sink_action(scp_sink_action *act)

{
  strbuf *psVar1;
  scp_sftp_dirstack *ptr;
  scp_sftp_dirstack *psVar2;
  FILE *pFVar3;
  _Bool _Var4;
  int iVar5;
  fxp_name *pfVar6;
  sftp_request *psVar7;
  sftp_packet *psVar8;
  char *pcVar9;
  fxp_names *names;
  size_t sVar10;
  scp_sftp_dirstack *psVar11;
  char *pcVar12;
  long lVar13;
  wchar_t wVar14;
  fxp_name *pfVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  fxp_name *local_98;
  size_t local_90;
  size_t namesize;
  fxp_handle *local_78;
  fxp_name *local_70;
  fxp_attrs attrs;
  
  ptr = scp_sftp_dirstack_head;
  bVar18 = 0;
  if (!using_sftp) {
    act->settime = false;
    strbuf_clear(act->buf);
LAB_0010f907:
    _Var4 = ssh_scp_recv(&namesize,1);
    if (!_Var4) goto LAB_0010fbd5;
    bVar18 = (byte)namesize;
    if ((byte)namesize == 10) {
      pcVar9 = "Protocol error: Unexpected newline";
    }
    else {
      while( true ) {
        _Var4 = ssh_scp_recv(&namesize,1);
        if (!_Var4) {
          pcVar9 = "Lost connection";
          goto LAB_00110115;
        }
        if ((byte)namesize == '\n') break;
        BinarySink_put_byte(act->buf->binarysink_,(byte)namesize);
      }
      if (bVar18 == 1) {
        pcVar9 = stripctrl_string(string_scc,act->buf->s);
        while (pcVar9 != (char *)0x0) {
          tell_user(_stderr,"%s",pcVar9);
          safefree(pcVar9);
          pcVar9 = (char *)0x0;
        }
        errs = errs + L'\x01';
        goto LAB_0010f907;
      }
      if (bVar18 != 0x54) {
        if (bVar18 - 0x43 < 2) {
          act->action = (uint)(bVar18 != 0x43) + L'\x01';
          if ((bVar18 == 0x43) || (recursive != '\0')) {
            iVar16 = __isoc99_sscanf(act->buf->s,"%lo %lu %n",&act->permissions,&act->size,&attrs);
            if (iVar16 == 2) {
              act->name = act->buf->s + (int)(uint)attrs.flags;
              return L'\0';
            }
            pcVar9 = "Protocol error: Illegal file descriptor format";
          }
          else {
            pcVar9 = 
            "security violation: remote host attempted to create a subdirectory in a non-recursive copy!"
            ;
          }
          goto LAB_00110115;
        }
        if (bVar18 == 2) {
          pcVar9 = stripctrl_string(string_scc,act->buf->s);
          if (pcVar9 != (char *)0x0) {
            bump("%s",pcVar9);
          }
        }
        else if (bVar18 != 0x45) {
          pcVar9 = "Protocol error: Expected control record";
          goto LAB_00110115;
        }
        (*backend->vt->send)(backend,anon_var_dwarf_3291b + 10,1);
        act->action = L'\x03';
        pfVar6 = (fxp_name *)scp_sftp_currentname;
        goto LAB_0010fcfd;
      }
      iVar16 = __isoc99_sscanf(act->buf->s,"%lu %*d %lu %*d",&act->mtime,&act->atime);
      if (iVar16 == 2) {
        act->settime = true;
        (*backend->vt->send)(backend,anon_var_dwarf_3291b + 10,1);
        strbuf_clear(act->buf);
        goto LAB_0010f907;
      }
      pcVar9 = "Protocol error: Illegal time format";
    }
LAB_00110115:
    bump(pcVar9);
  }
  if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
    if (scp_sftp_donethistarget == '\0') {
      scp_sftp_donethistarget = '\x01';
      pfVar6 = (fxp_name *)scp_sftp_remotepath;
      goto LAB_0010fb23;
    }
LAB_0010fbd5:
    wVar14 = L'\x01';
  }
  else {
    iVar16 = scp_sftp_dirstack_head->namepos;
    while (iVar5 = ptr->namelen, iVar16 < iVar5) {
      pcVar9 = ptr->names[iVar16].filename;
      _Var4 = is_dots(pcVar9);
      if (!_Var4) {
        if (ptr->wildcard == (char *)0x0) break;
        iVar5 = wc_match(ptr->wildcard,pcVar9);
        iVar16 = ptr->namepos;
        if (iVar5 != 0) {
          iVar5 = ptr->namelen;
          break;
        }
      }
      iVar16 = iVar16 + 1;
      ptr->namepos = iVar16;
    }
    if (iVar16 < iVar5) {
      ptr->matched_something = true;
      ptr->namepos = iVar16 + 1;
      pfVar6 = (fxp_name *)dupcat_fn(ptr->dirpath,"/",ptr->names[iVar16].filename,0);
LAB_0010fb23:
      psVar7 = fxp_stat_send((char *)pfVar6);
      psVar8 = sftp_wait_for_reply(psVar7);
      _Var4 = fxp_stat_recv(psVar8,psVar7,&attrs);
      if ((!_Var4) || (((uint)attrs.flags & 4) == 0)) {
        local_70 = pfVar6;
        pcVar9 = stripctrl_string(string_scc,(char *)pfVar6);
        while (pFVar3 = _stderr, pcVar9 != (char *)0x0) {
          pcVar12 = "file type not supplied";
          if (!_Var4) {
            pcVar12 = fxp_error();
          }
          tell_user(pFVar3,"unable to identify %s: %s",pcVar9,pcVar12);
          safefree(pcVar9);
          pcVar9 = (char *)0x0;
        }
        pfVar6 = local_70;
        if (ptr != (scp_sftp_dirstack *)0x0) goto LAB_0010fbca;
LAB_0010fbcf:
        errs = errs + L'\x01';
        goto LAB_0010fbd5;
      }
      if ((attrs.permissions._1_1_ & 0x40) == 0) {
        act->action = L'\x01';
        strbuf_clear(act->buf);
        psVar1 = act->buf;
        _Var4 = false;
        pcVar9 = stripslashes((char *)pfVar6,false);
        BinarySink_put_asciz(psVar1->binarysink_,pcVar9);
        act->name = act->buf->s;
        act->size = -(ulong)(((uint)attrs.flags & 1) == 0) | attrs.size;
        act->permissions =
             (ulong)(CONCAT11(attrs.permissions._1_1_,(undefined1)attrs.permissions) & 0xfff);
        if ((((uint)attrs.flags & 8) != 0) && (scp_sftp_preserve != false)) {
          act->atime = attrs.atime;
          act->mtime = attrs.mtime;
          _Var4 = true;
        }
        act->settime = _Var4;
        if (ptr == (scp_sftp_dirstack *)0x0) {
          pfVar6 = (fxp_name *)dupstr((char *)pfVar6);
        }
      }
      else {
        if ((scp_sftp_recursive != false) || (scp_sftp_wildcard != (char *)0x0)) {
          psVar7 = fxp_opendir_send((char *)pfVar6);
          psVar8 = sftp_wait_for_reply(psVar7);
          local_78 = fxp_opendir_recv(psVar8,psVar7);
          if (local_78 == (fxp_handle *)0x0) {
            pcVar9 = stripctrl_string(string_scc,(char *)pfVar6);
            while (pFVar3 = _stderr, pcVar9 != (char *)0x0) {
              pcVar12 = fxp_error();
              tell_user(pFVar3,"pscp: unable to open directory %s: %s",pcVar9,pcVar12);
              safefree(pcVar9);
              pcVar9 = (char *)0x0;
            }
            if (ptr == (scp_sftp_dirstack *)0x0) goto LAB_0010fbcf;
          }
          else {
            namesize = 0;
            local_90 = 0;
            local_98 = (fxp_name *)0x0;
            local_70 = pfVar6;
            while( true ) {
              pfVar15 = local_70;
              psVar7 = fxp_readdir_send(local_78);
              psVar8 = sftp_wait_for_reply(psVar7);
              names = fxp_readdir_recv(psVar8,psVar7);
              if (names == (fxp_names *)0x0) break;
              if ((long)names->nnames == 0) {
                fxp_free_names(names);
                goto LAB_0010ffbf;
              }
              local_98 = (fxp_name *)
                         safegrowarray(local_98,&namesize,0x48,local_90,(long)names->nnames,false);
              for (lVar17 = 0; lVar17 < names->nnames; lVar17 = lVar17 + 1) {
                pcVar9 = names->names[lVar17].filename;
                if ((*pcVar9 != '.') ||
                   ((pcVar9[1] != '\0' && ((pcVar9[1] != '.' || (pcVar9[2] != '\0')))))) {
                  _Var4 = vet_filename(pcVar9);
                  if (_Var4) {
                    sVar10 = local_90 + 1;
                    pfVar6 = names->names + lVar17;
                    pfVar15 = local_98 + local_90;
                    for (lVar13 = 9; local_90 = sVar10, lVar13 != 0; lVar13 = lVar13 + -1) {
                      pfVar15->filename = pfVar6->filename;
                      pfVar6 = (fxp_name *)((long)pfVar6 + (ulong)bVar18 * -0x10 + 8);
                      pfVar15 = (fxp_name *)((long)pfVar15 + (ulong)bVar18 * -0x10 + 8);
                    }
                  }
                  else {
                    pcVar9 = stripctrl_string(string_scc,names->names[lVar17].filename);
                    while (pcVar9 != (char *)0x0) {
                      tell_user(_stderr,
                                "ignoring potentially dangerous server-supplied filename \'%s\'",
                                pcVar9);
                      safefree(pcVar9);
                      pcVar9 = (char *)0x0;
                    }
                  }
                }
              }
              names->nnames = 0;
              fxp_free_names(names);
            }
            iVar16 = fxp_error_type();
            if (iVar16 == 1) {
LAB_0010ffbf:
              psVar7 = fxp_close_send(local_78);
              psVar8 = sftp_wait_for_reply(psVar7);
              fxp_close_recv(psVar8,psVar7);
              psVar11 = (scp_sftp_dirstack *)safemalloc(1,0x30,0);
              psVar2 = scp_sftp_dirstack_head;
              psVar11->namepos = 0;
              psVar11->next = psVar2;
              psVar11->names = local_98;
              psVar11->namelen = (int)local_90;
              pfVar6 = pfVar15;
              if (ptr == (scp_sftp_dirstack *)0x0) {
                pfVar6 = (fxp_name *)dupstr((char *)pfVar15);
              }
              psVar11->dirpath = (char *)pfVar6;
              pcVar9 = scp_sftp_wildcard;
              scp_sftp_dirstack_head = psVar11;
              if (scp_sftp_wildcard == (char *)0x0) {
                psVar11->wildcard = (char *)0x0;
                act->action = L'\x02';
                strbuf_clear(act->buf);
                psVar1 = act->buf;
                pcVar9 = stripslashes((char *)pfVar15,false);
                BinarySink_put_asciz(psVar1->binarysink_,pcVar9);
                act->name = act->buf->s;
                act->size = 0;
                act->permissions =
                     (ulong)(CONCAT11(attrs.permissions._1_1_,(undefined1)attrs.permissions) & 0xfff
                            );
                if ((scp_sftp_preserve == true) && (((uint)attrs.flags & 8) != 0)) {
                  act->atime = attrs.atime;
                  act->mtime = attrs.mtime;
                  act->settime = true;
                  return L'\0';
                }
                act->settime = false;
                return L'\0';
              }
              psVar11->matched_something = false;
              scp_sftp_wildcard = (char *)0x0;
              psVar11->wildcard = pcVar9;
              goto LAB_0011004a;
            }
            pcVar9 = stripctrl_string(string_scc,(char *)pfVar15);
            while (pFVar3 = _stderr, pcVar9 != (char *)0x0) {
              pcVar12 = fxp_error();
              tell_user(pFVar3,"pscp: reading directory %s: %s",pcVar9,pcVar12);
              safefree(pcVar9);
              pcVar9 = (char *)0x0;
            }
            psVar7 = fxp_close_send(local_78);
            psVar8 = sftp_wait_for_reply(psVar7);
            fxp_close_recv(psVar8,psVar7);
            pfVar6 = local_98;
            if (ptr != (scp_sftp_dirstack *)0x0) {
              safefree(pfVar15);
            }
          }
LAB_0010fbca:
          safefree(pfVar6);
          goto LAB_0010fbcf;
        }
        pcVar9 = stripctrl_string(string_scc,(char *)pfVar6);
        while (pcVar9 != (char *)0x0) {
          tell_user(_stderr,"pscp: %s: is a directory",pcVar9);
          safefree(pcVar9);
          pcVar9 = (char *)0x0;
        }
        errs = errs + L'\x01';
        if (ptr != (scp_sftp_dirstack *)0x0) {
          safefree(pfVar6);
        }
        if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) goto LAB_0010fbd5;
LAB_0011004a:
        act->action = L'\x04';
        pfVar6 = (fxp_name *)scp_sftp_currentname;
      }
    }
    else {
      pcVar9 = ptr->wildcard;
      if (pcVar9 == (char *)0x0) {
        act->action = L'\x03';
      }
      else {
        act->action = L'\x04';
        if (ptr->matched_something == false) {
          tell_user(_stderr,"pscp: wildcard \'%s\' matched no files");
          errs = errs + L'\x01';
          pcVar9 = ptr->wildcard;
        }
        safefree(pcVar9);
      }
      safefree(ptr->dirpath);
      safefree(ptr->names);
      scp_sftp_dirstack_head = ptr->next;
      safefree(ptr);
      pfVar6 = (fxp_name *)scp_sftp_currentname;
    }
LAB_0010fcfd:
    scp_sftp_currentname = (char *)pfVar6;
    wVar14 = L'\0';
  }
  return wVar14;
}

Assistant:

int scp_get_sink_action(struct scp_sink_action *act)
{
    if (using_sftp) {
        char *fname;
        bool must_free_fname;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (!scp_sftp_dirstack_head) {
            if (!scp_sftp_donethistarget) {
                /*
                 * Simple case: we are only dealing with one file.
                 */
                fname = scp_sftp_remotepath;
                must_free_fname = false;
                scp_sftp_donethistarget = true;
            } else {
                /*
                 * Even simpler case: one file _which we've done_.
                 * Return 1 (finished).
                 */
                return 1;
            }
        } else {
            /*
             * We're now in the middle of stepping through a list
             * of names returned from fxp_readdir(); so let's carry
             * on.
             */
            struct scp_sftp_dirstack *head = scp_sftp_dirstack_head;
            while (head->namepos < head->namelen &&
                   (is_dots(head->names[head->namepos].filename) ||
                    (head->wildcard &&
                     !wc_match(head->wildcard,
                               head->names[head->namepos].filename))))
                head->namepos++;       /* skip . and .. */
            if (head->namepos < head->namelen) {
                head->matched_something = true;
                fname = dupcat(head->dirpath, "/",
                               head->names[head->namepos++].filename);
                must_free_fname = true;
            } else {
                /*
                 * We've come to the end of the list; pop it off
                 * the stack and return an ENDDIR action (or RETRY
                 * if this was a wildcard match).
                 */
                if (head->wildcard) {
                    act->action = SCP_SINK_RETRY;
                    if (!head->matched_something) {
                        tell_user(stderr, "pscp: wildcard '%s' matched "
                                  "no files", head->wildcard);
                        errs++;
                    }
                    sfree(head->wildcard);

                } else {
                    act->action = SCP_SINK_ENDDIR;
                }

                sfree(head->dirpath);
                sfree(head->names);
                scp_sftp_dirstack_head = head->next;
                sfree(head);

                return 0;
            }
        }

        /*
         * Now we have a filename. Stat it, and see if it's a file
         * or a directory.
         */
        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
            with_stripctrl(san, fname)
                tell_user(stderr, "unable to identify %s: %s", san,
                          ret ? "file type not supplied" : fxp_error());
            if (must_free_fname) sfree(fname);
            errs++;
            return 1;
        }

        if (attrs.permissions & 0040000) {
            struct scp_sftp_dirstack *newitem;
            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name *ournames;
            struct fxp_names *names;

            /*
             * It's a directory. If we're not in recursive mode,
             * this merits a complaint (which is fatal if the name
             * was specified directly, but not if it was matched by
             * a wildcard).
             *
             * We skip this complaint completely if
             * scp_sftp_wildcard is set, because that's an
             * indication that we're not actually supposed to
             * _recursively_ transfer the dir, just scan it for
             * things matching the wildcard.
             */
            if (!scp_sftp_recursive && !scp_sftp_wildcard) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: %s: is a directory", san);
                errs++;
                if (must_free_fname) sfree(fname);
                if (scp_sftp_dirstack_head) {
                    act->action = SCP_SINK_RETRY;
                    return 0;
                } else {
                    return 1;
                }
            }

            /*
             * Otherwise, the fun begins. We must fxp_opendir() the
             * directory, slurp the filenames into memory, return
             * SCP_SINK_DIR (unless this is a wildcard match), and
             * set targetisdir. The next time we're called, we will
             * run through the list of filenames one by one,
             * matching them against a wildcard if present.
             *
             * If targetisdir is _already_ set (meaning we're
             * already in the middle of going through another such
             * list), we must push the other (target,namelist) pair
             * on a stack.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: unable to open directory %s: %s",
                              san, fxp_error());
                if (must_free_fname) sfree(fname);
                errs++;
                return 1;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        tell_user(stderr, "pscp: reading directory %s: %s",
                                  san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    if (must_free_fname) sfree(fname);
                    sfree(ournames);
                    errs++;
                    return 1;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++) {
                    if (!strcmp(names->names[i].filename, ".") ||
                        !strcmp(names->names[i].filename, "..")) {
                        /*
                         * . and .. are normal consequences of
                         * reading a directory, and aren't worth
                         * complaining about.
                         */
                    } else if (!vet_filename(names->names[i].filename)) {
                        with_stripctrl(san, names->names[i].filename)
                            tell_user(stderr, "ignoring potentially dangerous "
                                      "server-supplied filename '%s'", san);
                    } else
                        ournames[nnames++] = names->names[i];
                }
                names->nnames = 0;             /* prevent free_names */
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            newitem = snew(struct scp_sftp_dirstack);
            newitem->next = scp_sftp_dirstack_head;
            newitem->names = ournames;
            newitem->namepos = 0;
            newitem->namelen = nnames;
            if (must_free_fname)
                newitem->dirpath = fname;
            else
                newitem->dirpath = dupstr(fname);
            if (scp_sftp_wildcard) {
                newitem->wildcard = scp_sftp_wildcard;
                newitem->matched_something = false;
                scp_sftp_wildcard = NULL;
            } else {
                newitem->wildcard = NULL;
            }
            scp_sftp_dirstack_head = newitem;

            if (newitem->wildcard) {
                act->action = SCP_SINK_RETRY;
            } else {
                act->action = SCP_SINK_DIR;
                strbuf_clear(act->buf);
                put_asciz(act->buf, stripslashes(fname, false));
                act->name = act->buf->s;
                act->size = 0;     /* duhh, it's a directory */
                act->permissions = 07777 & attrs.permissions;
                if (scp_sftp_preserve &&
                    (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                    act->atime = attrs.atime;
                    act->mtime = attrs.mtime;
                    act->settime = true;
                } else
                    act->settime = false;
            }
            return 0;

        } else {
            /*
             * It's a file. Return SCP_SINK_FILE.
             */
            act->action = SCP_SINK_FILE;
            strbuf_clear(act->buf);
            put_asciz(act->buf, stripslashes(fname, false));
            act->name = act->buf->s;
            if (attrs.flags & SSH_FILEXFER_ATTR_SIZE) {
                act->size = attrs.size;
            } else
                act->size = UINT64_MAX;   /* no idea */
            act->permissions = 07777 & attrs.permissions;
            if (scp_sftp_preserve &&
                (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                act->atime = attrs.atime;
                act->mtime = attrs.mtime;
                act->settime = true;
            } else
                act->settime = false;
            if (must_free_fname)
                scp_sftp_currentname = fname;
            else
                scp_sftp_currentname = dupstr(fname);
            return 0;
        }

    } else {
        bool done = false;
        int action;
        char ch;

        act->settime = false;
        strbuf_clear(act->buf);

        while (!done) {
            if (!ssh_scp_recv(&ch, 1))
                return 1;
            if (ch == '\n')
                bump("Protocol error: Unexpected newline");
            action = ch;
            while (1) {
                if (!ssh_scp_recv(&ch, 1))
                    bump("Lost connection");
                if (ch == '\n')
                    break;
                put_byte(act->buf, ch);
            }
            switch (action) {
              case '\01':                      /* error */
                with_stripctrl(san, act->buf->s)
                    tell_user(stderr, "%s", san);
                errs++;
                continue;                      /* go round again */
              case '\02':                      /* fatal error */
                with_stripctrl(san, act->buf->s)
                    bump("%s", san);
              case 'E':
                backend_send(backend, "", 1);
                act->action = SCP_SINK_ENDDIR;
                return 0;
              case 'T':
                if (sscanf(act->buf->s, "%lu %*d %lu %*d",
                           &act->mtime, &act->atime) == 2) {
                    act->settime = true;
                    backend_send(backend, "", 1);
                    strbuf_clear(act->buf);
                    continue;          /* go round again */
                }
                bump("Protocol error: Illegal time format");
              case 'C':
              case 'D':
                act->action = (action == 'C' ? SCP_SINK_FILE : SCP_SINK_DIR);
                if (act->action == SCP_SINK_DIR && !recursive) {
                    bump("security violation: remote host attempted to create "
                         "a subdirectory in a non-recursive copy!");
                }
                break;
              default:
                bump("Protocol error: Expected control record");
            }
            /*
             * We will go round this loop only once, unless we hit
             * `continue' above.
             */
            done = true;
        }

        /*
         * If we get here, we must have seen SCP_SINK_FILE or
         * SCP_SINK_DIR.
         */
        {
            int i;
            if (sscanf(act->buf->s, "%lo %"SCNu64" %n", &act->permissions,
                       &act->size, &i) != 2)
                bump("Protocol error: Illegal file descriptor format");
            act->name = act->buf->s + i;
            return 0;
        }
    }
}